

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

void Ssc_GiaResetSimInfo(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *p_00;
  int iVar2;
  
  iVar1 = p->vSimsPi->nSize;
  iVar2 = p->vCis->nSize;
  if (iVar1 % iVar2 == 0) {
    p_00 = p->vSims;
    if (p_00 == (Vec_Wrd_t *)0x0) {
      p_00 = Vec_WrdAlloc(0);
      p->vSims = p_00;
    }
    iVar2 = iVar2 - p->nRegs;
    Vec_WrdFill(p_00,(iVar1 / iVar2) * p->nObjs,(long)iVar1 % (long)iVar2 & 0xffffffff);
    return;
  }
  __assert_fail("Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                ,0xf2,"void Ssc_GiaResetSimInfo(Gia_Man_t *)");
}

Assistant:

void Ssc_GiaResetSimInfo( Gia_Man_t * p )
{
    assert( Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0 );
    if ( p->vSims == NULL )
        p->vSims = Vec_WrdAlloc(0);
    Vec_WrdFill( p->vSims, Gia_ObjSimWords(p) * Gia_ManObjNum(p), 0 );
}